

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O0

void __thiscall CppUnit::TestPath::TestPath(TestPath *this,Test *searchRoot,string *pathAsString)

{
  uint uVar1;
  __type _Var2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  undefined4 extraout_var;
  reference pvVar6;
  undefined4 extraout_var_00;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  uint local_94;
  byte local_8d;
  int childIndex;
  bool childFound;
  Test *pTStack_88;
  uint index;
  Test *parentTest;
  undefined1 local_70 [8];
  PathTestNames testNames;
  string *pathAsString_local;
  Test *searchRoot_local;
  TestPath *this_local;
  
  this->_vptr_TestPath = (_func_int **)&PTR__TestPath_001a2138;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  testNames.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)pathAsString;
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::deque(&this->m_tests);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_70);
  pTStack_88 = findActualRoot(this,searchRoot,
                              (string *)
                              testNames.
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,
                              (PathTestNames *)local_70);
  (*this->_vptr_TestPath[3])(this,pTStack_88);
  childIndex = 1;
  do {
    uVar4 = (ulong)(uint)childIndex;
    sVar5 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70);
    if (sVar5 <= uVar4) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70);
      return;
    }
    local_8d = 0;
    local_94 = 0;
    while( true ) {
      uVar1 = local_94;
      iVar3 = (*pTStack_88->_vptr_Test[4])();
      if (iVar3 <= (int)uVar1) break;
      iVar3 = (*pTStack_88->_vptr_Test[5])(pTStack_88,(ulong)local_94);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))(&local_b8);
      pvVar6 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(ulong)(uint)childIndex);
      _Var2 = std::operator==(&local_b8,pvVar6);
      std::__cxx11::string::~string((string *)&local_b8);
      if (_Var2) {
        local_8d = 1;
        iVar3 = (*pTStack_88->_vptr_Test[5])(pTStack_88,(ulong)local_94);
        pTStack_88 = (Test *)CONCAT44(extraout_var_00,iVar3);
        break;
      }
      local_94 = local_94 + 1;
    }
    if ((local_8d & 1) == 0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      pvVar6 = std::
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(ulong)(uint)childIndex);
      std::operator+(&local_138,"TestPath::TestPath(): failed to resolve test name <",pvVar6);
      std::operator+(&local_118,&local_138,"> of path <");
      std::operator+(&local_f8,&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     testNames.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::operator+(&local_d8,&local_f8,">");
      std::invalid_argument::invalid_argument(this_00,(string *)&local_d8);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    (*this->_vptr_TestPath[3])(this,pTStack_88);
    childIndex = childIndex + 1;
  } while( true );
}

Assistant:

TestPath::TestPath( Test *searchRoot, 
                    const std::string &pathAsString )
    : m_tests()
{
  PathTestNames testNames;

  Test *parentTest = findActualRoot( searchRoot, pathAsString, testNames );
  add( parentTest );

  for ( unsigned int index = 1; index < testNames.size(); ++index )
  {
    bool childFound = false;
    for ( int childIndex =0; childIndex < parentTest->getChildTestCount(); ++childIndex )
    {
      if ( parentTest->getChildTestAt( childIndex )->getName() == testNames[index] )
      {
        childFound = true;
        parentTest = parentTest->getChildTestAt( childIndex );
        break;
      }
    }

    if ( !childFound )
      throw std::invalid_argument( "TestPath::TestPath(): failed to resolve test name <"+
                                   testNames[index] + "> of path <" + pathAsString + ">" );

    add( parentTest );
  }
}